

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O0

bool __thiscall BamTools::ResolveTool::StatsFileReader::Open(StatsFileReader *this,string *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  StatsFileReader *in_RSI;
  char *in_RDI;
  
  Close(in_RSI);
  _Var2 = std::__cxx11::string::c_str();
  std::ifstream::open(in_RDI,_Var2);
  bVar1 = std::ios::good();
  return (bool)(bVar1 & 1);
}

Assistant:

bool ResolveTool::StatsFileReader::Open(const std::string& filename)
{

    // make sure stream is fresh
    Close();

    // attempt to open filename, return status
    m_stream.open(filename.c_str(), std::ifstream::in);
    return m_stream.good();
}